

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O3

void __thiscall QDtlsPrivateOpenSSL::storePeerCertificates(QDtlsPrivateOpenSSL *this)

{
  QSslConfiguration *pQVar1;
  char cVar2;
  X509 *x509;
  stack_st_X509 *x509_00;
  long in_FS_OFFSET;
  QSslCertificate peerCertificate;
  QArrayDataPointer<QSslCertificate> local_88;
  QArrayDataPointer<QSslCertificate> local_68;
  undefined1 local_50 [8];
  QArrayDataPointer<QSslCertificate> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  x509 = q_SSL_get1_peer_certificate((this->dtls).tlsConnection.value.ptr);
  local_50 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTlsPrivate::X509CertificateOpenSSL::certificateFromX509((X509CertificateOpenSSL *)local_50,x509);
  pQVar1 = &(this->super_QDtlsBasePrivate).dtlsConfiguration;
  QTlsBackend::storePeerCertificate(pQVar1,(QSslCertificate *)local_50);
  q_X509_free(x509);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QSslCertificate *)&DAT_aaaaaaaaaaaaaaaa;
  QSslConfiguration::peerCertificateChain();
  if ((char *)local_68.size == (char *)0x0) {
    x509_00 = q_SSL_get_peer_cert_chain((this->dtls).tlsConnection.value.ptr);
    QTlsPrivate::X509CertificateOpenSSL::stackOfX509ToQSslCertificates
              ((QList<QSslCertificate> *)&local_88,x509_00);
    local_48.size = local_68.size;
    local_48.ptr = local_68.ptr;
    local_48.d = local_68.d;
    local_68.size = local_88.size;
    local_68.ptr = local_88.ptr;
    local_68.d = local_88.d;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QSslCertificate *)0x0;
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_88);
    cVar2 = QSslCertificate::isNull();
    if ((cVar2 == '\0') && ((this->super_QDtlsBasePrivate).mode == SslServerMode)) {
      QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
                ((QMovableArrayOps<QSslCertificate> *)&local_68,0,(QSslCertificate *)local_50);
    }
    QTlsBackend::storePeerCertificateChain(pQVar1,(QList *)&local_68);
  }
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_68);
  QSslCertificate::~QSslCertificate((QSslCertificate *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDtlsPrivateOpenSSL::storePeerCertificates()
{
    Q_ASSERT(dtls.tlsConnection.data());
    // Store the peer certificate and chain. For clients, the peer certificate
    // chain includes the peer certificate; for servers, it doesn't. Both the
    // peer certificate and the chain may be empty if the peer didn't present
    // any certificate.
    X509 *x509 = q_SSL_get_peer_certificate(dtls.tlsConnection.data());
    const auto peerCertificate = QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(x509);
    QTlsBackend::storePeerCertificate(dtlsConfiguration, peerCertificate);
    q_X509_free(x509);

    auto peerCertificateChain = dtlsConfiguration.peerCertificateChain();
    if (peerCertificateChain.isEmpty()) {
        auto stack = q_SSL_get_peer_cert_chain(dtls.tlsConnection.data());
        peerCertificateChain = QTlsPrivate::X509CertificateOpenSSL::stackOfX509ToQSslCertificates(stack);
        if (!peerCertificate.isNull() && mode == QSslSocket::SslServerMode)
            peerCertificateChain.prepend(peerCertificate);
        QTlsBackend::storePeerCertificateChain(dtlsConfiguration, peerCertificateChain);
    }
}